

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_reduce.hpp
# Opt level: O1

BBox<3> * __thiscall
Omega_h::
transform_reduce<Omega_h::IntIterator,Omega_h::GetBBoxOp<3>,Omega_h::BBox<3>,Omega_h::UniteOp<3>>
          (BBox<3> *__return_storage_ptr__,int param_2,int first,ulong *param_4,undefined8 param_5,
          undefined8 param_6,double init,double param_8,double param_9,double param_10,
          double param_11,double param_12)

{
  int *piVar1;
  undefined8 *puVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  Int i;
  long lVar10;
  Alloc *this;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  BBox<3> c;
  double local_a8 [6];
  double local_78 [3];
  double adStack_60 [4];
  double local_40 [6];
  
  this = (Alloc *)*param_4;
  uVar7 = param_4[1];
  if (((ulong)this & 7) == 0 && this != (Alloc *)0x0) {
    this->use_count = this->use_count + -1;
    this = (Alloc *)(this->size * 8 + 1);
  }
  *param_4 = 0;
  param_4[1] = 0;
  entering_parallel = 0;
  if (param_2 != first) {
    iVar8 = 0;
    iVar9 = param_2;
    do {
      lVar10 = (long)((iVar8 + param_2) * 3);
      puVar2 = (undefined8 *)(uVar7 + lVar10 * 8);
      pdVar3 = (double *)(uVar7 + lVar10 * 8);
      local_a8[4] = (double)puVar2[1];
      local_a8[5] = (double)*(undefined8 *)(uVar7 + 0x10 + lVar10 * 8);
      local_a8[2] = (double)*(undefined8 *)(uVar7 + 0x10 + lVar10 * 8);
      local_a8[3] = (double)*puVar2;
      local_a8[0] = *pdVar3;
      local_a8[1] = pdVar3[1];
      adStack_60[1] = param_11;
      adStack_60[2] = param_12;
      local_78[2] = param_9;
      adStack_60[0] = param_10;
      local_78[0] = init;
      local_78[1] = param_8;
      lVar10 = 0;
      do {
        dVar4 = local_a8[lVar10];
        uVar11 = SUB84(dVar4,0);
        uVar12 = (undefined4)((ulong)dVar4 >> 0x20);
        dVar5 = local_a8[lVar10 + 3];
        uVar13 = SUB84(dVar5,0);
        uVar14 = (undefined4)((ulong)dVar5 >> 0x20);
        dVar6 = local_a8[lVar10 + 6];
        if (dVar6 <= dVar4) {
          uVar11 = SUB84(dVar6,0);
          uVar12 = (undefined4)((ulong)dVar6 >> 0x20);
        }
        dVar4 = local_a8[lVar10 + 9];
        if (dVar5 <= dVar4) {
          uVar13 = SUB84(dVar4,0);
          uVar14 = (undefined4)((ulong)dVar4 >> 0x20);
        }
        local_40[lVar10] = (double)CONCAT44(uVar12,uVar11);
        local_40[lVar10 + 3] = (double)CONCAT44(uVar14,uVar13);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
      init = local_40[0];
      param_8 = local_40[1];
      param_9 = local_40[2];
      param_10 = local_40[3];
      param_11 = local_40[4];
      param_12 = local_40[5];
      iVar9 = iVar9 + 1;
      iVar8 = iVar8 + 1;
    } while (iVar9 != first);
  }
  (__return_storage_ptr__->max).super_Few<double,_3>.array_[1] = param_11;
  (__return_storage_ptr__->max).super_Few<double,_3>.array_[2] = param_12;
  (__return_storage_ptr__->min).super_Few<double,_3>.array_[2] = param_9;
  (__return_storage_ptr__->max).super_Few<double,_3>.array_[0] = param_10;
  (__return_storage_ptr__->min).super_Few<double,_3>.array_[0] = init;
  (__return_storage_ptr__->min).super_Few<double,_3>.array_[1] = param_8;
  if (((ulong)this & 7) == 0 && this != (Alloc *)0x0) {
    piVar1 = &this->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(this);
      operator_delete(this,0x48);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result transform_reduce(
    Iterator first, Iterator last, Result init, Op op, Tranform&& transform) {
  Omega_h::entering_parallel = true;
  auto const transform_local = std::move(transform);
  Omega_h::entering_parallel = false;
  for (; first != last; ++first) {
    init = op(std::move(init), transform_local(*first));
  }
  return init;
}